

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O3

bool __thiscall
std::less<ftxui::(anonymous_namespace)::TileEncoding>::operator()
          (less<ftxui::(anonymous_namespace)::TileEncoding> *this,TileEncoding *__x,
          TileEncoding *__y)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  
  uVar2 = (ushort)this & 3;
  uVar3 = (ushort)__x & 3;
  bVar1 = true;
  if (uVar3 <= uVar2) {
    if (uVar2 <= uVar3) {
      uVar2 = (ushort)((ulong)this >> 2) & 3;
      uVar3 = (ushort)((ulong)__x >> 2) & 3;
      if (uVar2 < uVar3) {
        return true;
      }
      if (uVar2 <= uVar3) {
        uVar2 = (ushort)((ulong)this >> 4) & 3;
        uVar3 = (ushort)((ulong)__x >> 4) & 3;
        if (uVar2 < uVar3) {
          return true;
        }
        if (uVar2 <= uVar3) {
          uVar2 = (ushort)((ulong)this >> 6) & 3;
          uVar3 = (ushort)((ulong)__x >> 6) & 3;
          if (uVar2 < uVar3) {
            return true;
          }
          if (uVar2 <= uVar3) {
            return ((ushort)((ulong)this >> 8) & 1) < (ushort)(((uint)__x >> 8 & 1) != 0);
          }
        }
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator<(const TileEncoding& other) const {
    if (left < other.left)   { return  true;  }
    if (left > other.left)   { return  false; }
    if (top < other.top)     { return  true;  }
    if (top > other.top)     { return  false; }
    if (right < other.right) { return  true;  }
    if (right > other.right) { return  false; }
    if (down < other.down)   { return  true;  }
    if (down > other.down)   { return  false; }
    if (round < other.round) { return  true;  }
    if (round > other.round) { return  false; }
      return false;
  }